

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

void dump_fasta(char *mapped_characters,long firstSequenceLength,FILE *output,bool newln,
               bool is_prot,unsigned_long from,unsigned_long to)

{
  byte in_CL;
  FILE *in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  ulong in_R9;
  ulong in_stack_00000008;
  long c_1;
  long c;
  char local_3a;
  char local_39;
  long local_38;
  ulong local_30;
  
  local_30 = in_R9;
  if ((in_R9 == 0) && (in_stack_00000008 == 0)) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if ((in_R8B & 1) == 0) {
        local_3a = "ACGTURYSWKMBDHVN?-"[*(byte *)(in_RDI + local_38)];
      }
      else {
        local_3a = "ACDEFGHIKLMNPQRSTVWYBZX?-"[*(byte *)(in_RDI + local_38)];
      }
      fputc((int)local_3a,in_RDX);
    }
  }
  else {
    for (; local_30 <= in_stack_00000008; local_30 = local_30 + 1) {
      if ((in_R8B & 1) == 0) {
        local_39 = "ACGTURYSWKMBDHVN?-"[*(byte *)(in_RDI + local_30)];
      }
      else {
        local_39 = "ACDEFGHIKLMNPQRSTVWYBZX?-"[*(byte *)(in_RDI + local_30)];
      }
      fputc((int)local_39,in_RDX);
    }
  }
  if ((in_CL & 1) != 0) {
    fprintf(in_RDX,"\n");
  }
  return;
}

Assistant:

void dump_fasta (const char* mapped_characters, const long firstSequenceLength, FILE *output, bool newln, bool is_prot, unsigned long from, unsigned long to) {
  if (from > 0 || to > 0) {
    for (long c = from; c <= to; c++) {
      fputc( is_prot ? ValidCharsAA[(unsigned char)mapped_characters[c]] : ValidChars[(unsigned char)mapped_characters[c]], output);
    }
  } else {
    for (long c = 0; c < firstSequenceLength; c++) {
      fputc( is_prot ? ValidCharsAA[(unsigned char)mapped_characters[c]] : ValidChars[(unsigned char)mapped_characters[c]], output);
    }
  }
  if (newln) {
    fprintf (output, "\n"); 
  }
}